

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  bool bVar1;
  SnapPromiseAllSettledResolveOrRejectElementFunctionInfo *capabilityInfo;
  ScriptContext *ctx_00;
  JavascriptPromiseCapability *capabilities_00;
  JavascriptLibrary *pJVar2;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *pJVar3;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *pJVar4;
  RecyclableObject *pRVar5;
  RecyclableObject *values;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper_1;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *wrapper;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingWrapper;
  JavascriptPromiseCapability *capabilities;
  ScriptContext *ctx;
  SnapPromiseAllSettledResolveOrRejectElementFunctionInfo *aInfo;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  capabilityInfo =
       SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)32>
                 (snpObject);
  ctx_00 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  capabilities_00 =
       NSSnapValues::InflatePromiseCapabilityInfo(&capabilityInfo->Capabilities,ctx_00,inflator);
  bVar1 = InflateMap::
          IsPromiseInfoDefined<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>
                    (inflator,capabilityInfo->RemainingElementsWrapperId);
  if (!bVar1) {
    pJVar2 = Js::ScriptContext::GetLibrary(ctx_00);
    pJVar3 = Js::JavascriptLibrary::CreateRemainingElementsWrapper_TTD
                       (pJVar2,ctx_00,capabilityInfo->RemainingElementsValue);
    InflateMap::
    AddInflatedPromiseInfo<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>
              (inflator,capabilityInfo->RemainingElementsWrapperId,pJVar3);
  }
  pJVar3 = InflateMap::
           LookupInflatedPromiseInfo<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>
                     (inflator,capabilityInfo->RemainingElementsWrapperId);
  bVar1 = InflateMap::
          IsPromiseInfoDefined<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>
                    (inflator,capabilityInfo->AlreadyCalledWrapperId);
  if (!bVar1) {
    pJVar2 = Js::ScriptContext::GetLibrary(ctx_00);
    pJVar4 = Js::JavascriptLibrary::CreateAlreadyCalledWrapper_TTD
                       (pJVar2,ctx_00,(bool)(capabilityInfo->AlreadyCalledValue & 1));
    InflateMap::
    AddInflatedPromiseInfo<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>
              (inflator,capabilityInfo->AlreadyCalledWrapperId,pJVar4);
  }
  pJVar4 = InflateMap::
           LookupInflatedPromiseInfo<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>
                     (inflator,capabilityInfo->AlreadyCalledWrapperId);
  pRVar5 = InflateMap::LookupObject(inflator,capabilityInfo->Values);
  pJVar2 = Js::ScriptContext::GetLibrary(ctx_00);
  pRVar5 = Js::JavascriptLibrary::CreatePromiseAllSettledResolveOrRejectElementFunction_TTD
                     (pJVar2,capabilities_00,capabilityInfo->Index,pJVar3,pRVar5,pJVar4,
                      (bool)(capabilityInfo->IsRejecting & 1));
  return pRVar5;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            const SnapPromiseAllSettledResolveOrRejectElementFunctionInfo* aInfo = SnapObjectGetAddtlInfoAs<SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*, SnapObjectType::SnapPromiseAllSettledResolveOrRejectElementFunctionObject>(snpObject);
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            Js::JavascriptPromiseCapability* capabilities = InflatePromiseCapabilityInfo(&aInfo->Capabilities, ctx, inflator);

            if(!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>(aInfo->RemainingElementsWrapperId))
            {
                Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingWrapper = ctx->GetLibrary()->CreateRemainingElementsWrapper_TTD(ctx, aInfo->RemainingElementsValue);
                inflator->AddInflatedPromiseInfo(aInfo->RemainingElementsWrapperId, remainingWrapper);
            }
            Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* wrapper = inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>(aInfo->RemainingElementsWrapperId);

            if (!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>(aInfo->AlreadyCalledWrapperId))
            {
                Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper = ctx->GetLibrary()->CreateAlreadyCalledWrapper_TTD(ctx, aInfo->AlreadyCalledValue);
                inflator->AddInflatedPromiseInfo(aInfo->AlreadyCalledWrapperId, alreadyCalledWrapper);
            }
            Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper = inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>(aInfo->AlreadyCalledWrapperId);

            Js::RecyclableObject* values = inflator->LookupObject(aInfo->Values);

            return ctx->GetLibrary()->CreatePromiseAllSettledResolveOrRejectElementFunction_TTD(capabilities, aInfo->Index, wrapper, values, alreadyCalledWrapper, aInfo->IsRejecting);
        }